

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

void quantizeCoeffAndZigXDR
               (uint16_t *halfZigCoeff,float *dctvals,float *tolerances,uint16_t *halftols)

{
  uint16_t uVar1;
  long in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RDI;
  uint16_t herrTol3;
  uint16_t herrTol2;
  uint16_t herrTol1;
  uint16_t herrTol0;
  float errTol3;
  float errTol2;
  float errTol1;
  float errTol0;
  uint16_t src3;
  uint16_t src2;
  uint16_t src1;
  uint16_t src0;
  int i;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float errTol;
  uint32_t herrTol;
  uint32_t src;
  int local_24;
  
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 4) {
    float_to_half(0.0);
    float_to_half(0.0);
    float_to_half(0.0);
    float_to_half(0.0);
    errTol = *(float *)(CONCAT62(in_register_00000012,in_DX) + (long)(local_24 + 3) * 4);
    src = CONCAT22(*(undefined2 *)(in_RCX + (long)local_24 * 2),
                   *(undefined2 *)(in_RCX + (long)(local_24 + 1) * 2));
    herrTol = CONCAT22(*(undefined2 *)(in_RCX + (long)(local_24 + 2) * 2),
                       *(undefined2 *)(in_RCX + (long)(local_24 + 3) * 2));
    half_to_float(0);
    algoQuantize(src,herrTol,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    half_to_float(0);
    algoQuantize(src,herrTol,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    half_to_float(0);
    algoQuantize(src,herrTol,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    in_stack_ffffffffffffffb4 = (float)(herrTol & 0xffff);
    half_to_float(0);
    algoQuantize(src,herrTol,errTol,in_stack_ffffffffffffffb4);
    uVar1 = one_from_native16(0);
    *(uint16_t *)(in_RDI + (long)quantizeCoeffAndZigXDR::inv_remap[local_24] * 2) = uVar1;
    uVar1 = one_from_native16(0);
    *(uint16_t *)(in_RDI + (long)quantizeCoeffAndZigXDR::inv_remap[local_24 + 1] * 2) = uVar1;
    uVar1 = one_from_native16(0);
    *(uint16_t *)(in_RDI + (long)quantizeCoeffAndZigXDR::inv_remap[local_24 + 2] * 2) = uVar1;
    uVar1 = one_from_native16(0);
    *(uint16_t *)(in_RDI + (long)quantizeCoeffAndZigXDR::inv_remap[local_24 + 3] * 2) = uVar1;
    in_stack_ffffffffffffffb8 = errTol;
  }
  return;
}

Assistant:

static void
quantizeCoeffAndZigXDR (
    uint16_t* restrict    halfZigCoeff,
    const float* restrict dctvals,
    const float* restrict tolerances,
    const uint16_t* restrict halftols)
{
    //static const int remap[] = {
    //    0,  1,  8,  16, 9,  2,  3,  10, 17, 24, 32, 25, 18, 11, 4,  5,
    //    12, 19, 26, 33, 40, 48, 41, 34, 27, 20, 13, 6,  7,  14, 21, 28,
    //    35, 42, 49, 56, 57, 50, 43, 36, 29, 22, 15, 23, 30, 37, 44, 51,
    //    58, 59, 52, 45, 38, 31, 39, 46, 53, 60, 61, 54, 47, 55, 62, 63};
    // inv_remap computed from original zigzag lookup remap so we can
    // deposit into a random destination instead of pulling from a source
    // and save a temporary and loop
    static const int inv_remap[] = {
        0, 1, 5, 6, 14, 15, 27, 28, 2, 4, 7, 13, 16, 26, 29, 42,
        3, 8, 12, 17, 25, 30, 41, 43, 9, 11, 18, 24, 31, 40, 44, 53,
        10, 19, 23, 32, 39, 45, 52, 54, 20, 22, 33, 38, 46, 51, 55, 60,
        21, 34, 37, 47, 50, 56, 59, 61, 35, 36, 48, 49, 57, 58, 62, 63};

    // manually unrolling seems to help on at least x86
    for ( int i = 0; i < 64; i += 4 )
    {
        uint16_t       src0     = float_to_half (dctvals[i+0]);
        uint16_t       src1     = float_to_half (dctvals[i+1]);
        uint16_t       src2     = float_to_half (dctvals[i+2]);
        uint16_t       src3     = float_to_half (dctvals[i+3]);
        const float    errTol0  = tolerances[i+0];
        const float    errTol1  = tolerances[i+1];
        const float    errTol2  = tolerances[i+2];
        const float    errTol3  = tolerances[i+3];
        const uint16_t herrTol0 = halftols[i+0];
        const uint16_t herrTol1 = halftols[i+1];
        const uint16_t herrTol2 = halftols[i+2];
        const uint16_t herrTol3 = halftols[i+3];
        src0 = algoQuantize (src0, herrTol0, errTol0, half_to_float (src0));
        src1 = algoQuantize (src1, herrTol1, errTol1, half_to_float (src1));
        src2 = algoQuantize (src2, herrTol2, errTol2, half_to_float (src2));
        src3 = algoQuantize (src3, herrTol3, errTol3, half_to_float (src3));

        halfZigCoeff[inv_remap[i+0]] = one_from_native16 (src0);
        halfZigCoeff[inv_remap[i+1]] = one_from_native16 (src1);
        halfZigCoeff[inv_remap[i+2]] = one_from_native16 (src2);
        halfZigCoeff[inv_remap[i+3]] = one_from_native16 (src3);
    }
//    for ( int i = 0; i < 64; ++i )
//    {
//        uint16_t       src     = float_to_half (dctvals[i]);
//        const float    errTol  = tolerances[i];
//        const uint16_t herrTol = halftols[i];
//        src = algoQuantize (src, herrTol, errTol, half_to_float (src));
//        halfZigCoeff[inv_remap[i]] = one_from_native16 (src);
//    }
}